

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

void __thiscall cmListFileBacktrace::PrintTitle(cmListFileBacktrace *this,ostream *out)

{
  Snapshot *this_00;
  bool bVar1;
  char *pcVar2;
  cmListFileContext lfc;
  cmOutputConverter converter;
  string local_a8;
  cmListFileContext local_88;
  cmOutputConverter local_40;
  
  this_00 = &this->Snapshot;
  bVar1 = cmState::Snapshot::IsValid(this_00);
  if (bVar1) {
    cmOutputConverter::cmOutputConverter(&local_40,*this_00);
    cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&local_a8,this_00);
    cmListFileContext::FromCommandContext(&local_88,&this->Context,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    cmOutputConverter::Convert(&local_a8,&local_40,&local_88.FilePath,HOME,UNCHANGED);
    std::__cxx11::string::operator=((string *)&local_88.FilePath,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = " at ";
    if (local_88.Line == 0) {
      pcVar2 = " in ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,4);
    operator<<(out,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.FilePath._M_dataplus._M_p != &local_88.FilePath.field_2) {
      operator_delete(local_88.FilePath._M_dataplus._M_p,
                      local_88.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.Name._M_dataplus._M_p != &local_88.Name.field_2) {
      operator_delete(local_88.Name._M_dataplus._M_p,local_88.Name.field_2._M_allocated_capacity + 1
                     );
    }
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintTitle(std::ostream& out) const
{
  if (!this->Snapshot.IsValid())
    {
    return;
    }
  cmOutputConverter converter(this->Snapshot);
  cmListFileContext lfc =
      cmListFileContext::FromCommandContext(
        this->Context, this->Snapshot.GetExecutionListFile());
  lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
  out << (lfc.Line ? " at " : " in ") << lfc;
}